

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::api::anon_unknown_1::ComputePipeline::create
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  VkComputePipelineCreateInfo pipelineInfo;
  VkComputePipelineCreateInfo local_68;
  
  local_68.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_68.stage.pNext = (void *)0x0;
  local_68.stage.flags = 0;
  local_68.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
  local_68.stage.module.m_internal =
       (res->shaderModule).object.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_68.stage.pName = "main";
  local_68.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_68.layout.m_internal =
       (res->layout).object.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_68.basePipelineHandle.m_internal = 0;
  local_68.basePipelineIndex = 0;
  ::vk::createComputePipeline
            (__return_storage_ptr__,env->vkd,env->device,
             (VkPipelineCache)
             (res->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
             object.m_internal,&local_68,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipeline> create (const Environment& env, const Resources& res, const Parameters&)
	{
		const VkComputePipelineCreateInfo	pipelineInfo	=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,
			DE_NULL,
			(VkPipelineCreateFlags)0,
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				(VkPipelineShaderStageCreateFlags)0,
				VK_SHADER_STAGE_COMPUTE_BIT,
				*res.shaderModule.object,
				"main",
				DE_NULL					// pSpecializationInfo
			},
			*res.layout.object,
			(VkPipeline)0,				// basePipelineHandle
			0u,							// basePipelineIndex
		};

		return createComputePipeline(env.vkd, env.device, *res.pipelineCache.object, &pipelineInfo, env.allocationCallbacks);
	}